

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O1

void bloaty::macho::ReadDebugSectionsFromSegment<segment_command,section>
               (LoadCommand cmd,File *dwarf,RangeSink *sink)

{
  char *__string;
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  size_type sVar4;
  string_view *psVar5;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  bool bVar9;
  string_view sVar10;
  string_view name;
  string_view data;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  File *local_50;
  RangeSink *local_48;
  char *local_40;
  size_t local_38;
  
  local_50 = dwarf;
  if (0x37 < cmd.command_data._M_len) {
    uVar2 = cmd.command_data._M_len - 0x38;
    sVar3 = strnlen(cmd.command_data._M_str + 8,0x10);
    if (((sVar3 == 7) && (iVar1 = bcmp(cmd.command_data._M_str + 8,"__DWARF",7), iVar1 == 0)) &&
       (iVar1 = *(int *)(cmd.command_data._M_str + 0x30), iVar1 != 0)) {
      local_38 = cmd.file_data._M_len;
      local_40 = cmd.file_data._M_str;
      __string = cmd.command_data._M_str + 0x38;
      local_48 = sink;
      do {
        bVar9 = uVar2 < 0x44;
        uVar2 = uVar2 - 0x44;
        if (bVar9) goto LAB_00195d43;
        local_60._M_len = strnlen(__string,0x10);
        uVar8 = (ulong)*(uint *)(__string + 0x24);
        if (((byte)__string[0x38] < 0x13) && ((0x41002U >> ((byte)__string[0x38] & 0x1f) & 1) != 0))
        {
          uVar8 = 0;
        }
        uVar6 = (ulong)*(uint *)(__string + 0x28);
        local_60._M_str = __string;
        if (local_38 < uVar6 + uVar8) {
          Throw("region out-of-bounds",0x5d);
        }
        if (local_38 < uVar6) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     uVar6);
        }
        if (local_38 - uVar6 < uVar8) {
          uVar8 = local_38 - uVar6;
        }
        piVar7 = (int *)(local_40 + uVar6);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (&local_60,"__debug_",0,8);
        if (sVar4 == 0) {
          sVar10._M_str = local_60._M_str + 8;
          sVar10._M_len = local_60._M_len - 8;
          local_60._M_len = sVar10._M_len;
          local_60._M_str = sVar10._M_str;
          psVar5 = bloaty::dwarf::File::GetFieldByName(local_50,sVar10);
          if (psVar5 != (string_view *)0x0) {
            psVar5->_M_len = uVar8;
LAB_00195cd8:
            psVar5->_M_str = (char *)piVar7;
          }
        }
        else {
          sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (&local_60,"__zdebug_",0,9);
          if (sVar4 == 0) {
            name._M_str = local_60._M_str + 9;
            name._M_len = local_60._M_len - 9;
            local_60._M_len = name._M_len;
            local_60._M_str = name._M_str;
            psVar5 = bloaty::dwarf::File::GetFieldByName(local_50,name);
            if (psVar5 != (string_view *)0x0) {
              if (uVar8 < 4) {
                Throw("premature EOF reading variable-length DWARF data",0xad);
              }
              if (*piVar7 == 0x42494c5a) {
                if (uVar8 - 4 < 8) {
                  Throw("premature EOF reading fixed-length data",0x8d);
                }
                uVar6 = *(ulong *)(piVar7 + 1);
                data._M_str = (char *)(piVar7 + 3);
                data._M_len = uVar8 - 0xc;
                sVar10 = RangeSink::ZlibDecompress
                                   (local_48,data,
                                    uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                                    (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                                    (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                                    (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38);
                piVar7 = (int *)sVar10._M_str;
                psVar5->_M_len = sVar10._M_len;
                goto LAB_00195cd8;
              }
            }
          }
        }
        iVar1 = iVar1 + -1;
        __string = __string + 0x44;
      } while (iVar1 != 0);
    }
    return;
  }
LAB_00195d43:
  Throw("Premature EOF reading Mach-O data.",0x36);
}

Assistant:

void ReadDebugSectionsFromSegment(LoadCommand cmd, dwarf::File *dwarf,
                                  RangeSink *sink) {
  auto segment = GetStructPointerAndAdvance<Segment>(&cmd.command_data);
  string_view segname = ArrayToStr(segment->segname, 16);

  if (segname != "__DWARF") {
    return;
  }

  uint32_t nsects = segment->nsects;
  for (uint32_t j = 0; j < nsects; j++) {
    auto section = GetStructPointerAndAdvance<Section>(&cmd.command_data);
    string_view sectname = ArrayToStr(section->sectname, 16);

    // filesize equals vmsize unless the section is zerofill
    uint64_t filesize = section->size;
    switch (section->flags & SECTION_TYPE) {
      case S_ZEROFILL:
      case S_GB_ZEROFILL:
      case S_THREAD_LOCAL_ZEROFILL:
        filesize = 0;
        break;
      default:
        break;
    }

    string_view contents =
        StrictSubstr(cmd.file_data, section->offset, filesize);

    if (sectname.find("__debug_") == 0) {
      sectname.remove_prefix(string_view("__debug_").size());
      dwarf->SetFieldByName(sectname, contents);
    } else if (sectname.find("__zdebug_") == 0) {
      sectname.remove_prefix(string_view("__zdebug_").size());
      string_view *member = dwarf->GetFieldByName(sectname);
      if (!member || ReadBytes(4, &contents) != "ZLIB") {
        continue;
      }
      auto uncompressed_size = ReadBigEndian<uint64_t>(&contents);
      *member = sink->ZlibDecompress(contents, uncompressed_size);
    }
  }
}